

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3cue-main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *__src;
  mp3cue_track_t *__ptr;
  FILE *__stream;
  adu_t *adu;
  mp3_frame_t *frame_00;
  ulong uVar4;
  mp3cue_file_t *artist;
  char *pcVar5;
  unsigned_long time;
  file_t mp3file;
  file_t outfile;
  aq_t qout;
  mp3cue_file_t cuefile;
  aq_t qin;
  char outfilename [193];
  char from_buf [256];
  char to_buf [256];
  mp3_frame_t frame;
  int local_62e4;
  file_t local_62c0;
  file_t local_6298;
  aq_t local_6270;
  mp3cue_file_t local_6238;
  aq_t local_61a0;
  char local_6168 [208];
  char local_6098 [256];
  char local_5f98 [264];
  mp3_frame_t local_5e90;
  
  iVar3 = getopt(argc,argv,"c:C:");
  __src = (char *)0x0;
  while (-1 < iVar3) {
    if (iVar3 != 0x43) {
      if (iVar3 != 99) goto LAB_001045e6;
      if (__src != (char *)0x0) {
        free(__src);
      }
      __src = strdup(_optarg);
    }
    iVar3 = getopt(argc,argv,"c:C:");
  }
  if (_optind == argc) {
LAB_001045e6:
    puts("Usage: mp3cue -c cuefile mp3file");
    puts("-c cuefile: cut according to cue file");
    __stream = (FILE *)0x0;
    __ptr = (mp3cue_track_t *)0x0;
    local_62e4 = 0;
  }
  else {
    pcVar5 = argv[_optind];
    if (pcVar5 == (char *)0x0 || __src == (char *)0x0) {
      puts("Usage: mp3cue -c cuefile mp3file");
      puts("-c cuefile: cut according to cue file");
    }
    else {
      __ptr = (mp3cue_track_t *)malloc(0xbe0);
      if (__ptr != (mp3cue_track_t *)0x0) {
        yymp3_cue_file = &local_6238;
        local_6238.track_number = 0;
        local_6238.max_track_number = 0x14;
        local_6238.tracks = __ptr;
        strncpy(local_6238.title,__src,0x40);
        __stream = fopen(__src,"r");
        if (__stream == (FILE *)0x0) {
          __stream = (FILE *)0x0;
          fprintf(_stderr,"Could not open cuefile %s\n",__src);
        }
        else {
          yyin = (FILE *)__stream;
          iVar3 = yyparse();
          if (iVar3 == 0) {
            iVar3 = file_open_read(&local_62c0,pcVar5);
            if (iVar3 == 0) {
              fprintf(_stderr,"Could not open mp3 file: %s\n",pcVar5);
              return 0;
            }
            aq_init(&local_61a0);
            if (local_6238.track_number == 0) {
              local_62e4 = 0;
            }
            else {
              uVar4 = 0;
              time = 0;
              local_62e4 = 0;
              do {
                if ((local_6238.tracks[uVar4].performer[0] == '\0') ||
                   (local_6238.tracks[uVar4].title[0] == '\0')) {
                  snprintf(local_6168,0xc0,"%02d. %s.mp3",
                           (ulong)(uint)local_6238.tracks[uVar4].number,local_6238.title);
                }
                else {
                  snprintf(local_6168,0xc0,"%02d. %s - %s.mp3",
                           (ulong)(uint)local_6238.tracks[uVar4].number,
                           local_6238.tracks[uVar4].performer,local_6238.tracks[uVar4].title);
                }
                aq_init(&local_6270);
                iVar3 = file_open_write(&local_6298,local_6168);
                if (iVar3 == 0) {
                  fprintf(_stderr,"Could not open mp3 file: %s\n",local_6168);
                  file_close(&local_62c0);
                  iVar3 = 5;
                  local_62e4 = 1;
                }
                else {
                  uVar1 = ((local_6238.tracks[uVar4].index.minutes * 0x3c +
                           local_6238.tracks[uVar4].index.seconds) * 100 +
                          local_6238.tracks[uVar4].index.centiseconds) * 10;
                  format_time(time,local_6098,0x100);
                  pcVar5 = local_5f98;
                  format_time((ulong)uVar1,pcVar5,0x100);
                  if (uVar1 == 0) {
                    pcVar5 = "end";
                  }
                  printf("Extracting track %d (%s): %s - %s...\n",uVar4,local_6168,local_6098,pcVar5
                        );
                  artist = (mp3cue_file_t *)local_6238.tracks[uVar4].performer;
                  if (local_6238.tracks[uVar4].performer[0] == '\0') {
                    artist = &local_6238;
                  }
                  iVar3 = id3_write_tag(&local_6298,local_6238.title,artist->performer,
                                        local_6238.tracks[uVar4].title,
                                        local_6238.tracks[uVar4].number,
                                        "MP3 generated by mp3cue (http://bl0rg.net/software/poc/)");
                  if (iVar3 == 0) {
                    fprintf(_stderr,"Could not write id3 tags to file: %s\n",local_6168);
                    file_close(&local_6298);
                    file_close(&local_62c0);
                    iVar3 = 5;
                    local_62e4 = 1;
                  }
                  else {
                    do {
                      if ((uVar1 <= time) && (uVar4 != local_6238.track_number - 1))
                      goto LAB_00104abc;
                      iVar3 = mp3_next_frame(&local_62c0,&local_5e90);
                      if (iVar3 < 1) {
                        iVar3 = 10;
                        if (uVar4 != local_6238.track_number - 1) {
                          main_cold_1();
                        }
                      }
                      else {
                        iVar3 = aq_add_frame(&local_61a0,&local_5e90);
                        if (iVar3 != 0) {
                          adu = aq_get_adu(&local_61a0);
                          if (adu == (adu_t *)0x0) {
                            __assert_fail("adu != NULL",
                                          "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3cue-main.c"
                                          ,0xc5,"int main(int, char **)");
                          }
                          iVar3 = aq_add_adu(&local_6270,adu);
                          if (iVar3 == 0) {
LAB_00104985:
                            free(adu);
                            iVar3 = 0;
                          }
                          else {
                            frame_00 = aq_get_frame(&local_6270);
                            if (frame_00 == (mp3_frame_t *)0x0) {
                              __assert_fail("frame_out != NULL",
                                            "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3cue-main.c"
                                            ,0xc9,"int main(int, char **)");
                            }
                            memset(frame_00->raw,0,frame_00->si_size + 4);
                            iVar3 = mp3_fill_hdr(frame_00);
                            if (((iVar3 == 0) || (iVar3 = mp3_fill_si(frame_00), iVar3 == 0)) ||
                               (iVar3 = mp3_write_frame(&local_6298,frame_00), iVar3 < 1)) {
                              main_cold_2();
                              iVar3 = 5;
                              local_62e4 = 1;
                              bVar2 = false;
                            }
                            else {
                              free(frame_00);
                              iVar3 = 0;
                              bVar2 = true;
                            }
                            if (bVar2) goto LAB_00104985;
                          }
                          if (iVar3 != 0) goto LAB_001049db;
                        }
                        time = time + local_5e90.usec / 1000;
                        iVar3 = 0;
                      }
LAB_001049db:
                    } while (iVar3 == 0);
                    if (iVar3 == 10) {
LAB_00104abc:
                      file_close(&local_6298);
                      aq_destroy(&local_6270);
                      iVar3 = 0;
                      fprintf(_stderr,"%s written\n",local_6168);
                    }
                  }
                }
                if (iVar3 != 0) {
                  if (iVar3 != 5) {
                    return 0;
                  }
                  goto LAB_00104b5b;
                }
                uVar4 = uVar4 + 1;
              } while (uVar4 < (local_6238._132_8_ & 0xffffffff));
            }
            file_close(&local_62c0);
            aq_destroy(&local_61a0);
            goto LAB_00104b5b;
          }
        }
        local_62e4 = 1;
        goto LAB_00104b5b;
      }
      main_cold_3();
    }
    local_62e4 = 1;
    __stream = (FILE *)0x0;
    __ptr = (mp3cue_track_t *)0x0;
  }
LAB_00104b5b:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__ptr != (mp3cue_track_t *)0x0) {
    free(__ptr);
  }
  if (__src != (char *)0x0) {
    free(__src);
  }
  return local_62e4;
}

Assistant:

int main(int argc, char *argv[]) {
    char *cuefilename = NULL,
        *mp3filename = NULL;
    int retval = EXIT_SUCCESS;
    FILE *cuein = NULL;
    mp3cue_track_t *cuetracks = NULL;

    int c;
    while ((c = getopt(argc, argv, "c:C:")) >= 0) {
        switch (c) {
        case 'c':
            if (cuefilename != NULL) {
                free(cuefilename);
            }
            cuefilename = strdup(optarg);
            break;

        case 'C':
            break;

        default:
            usage();
            goto exit;
        }
    }

    if (optind == argc) {
        usage();
        goto exit;
    }
    mp3filename = argv[optind];

    if ((cuefilename == NULL) || (mp3filename == NULL)) {
        usage();
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Initialize the mp3 cue structure.
    **/
    mp3cue_file_t cuefile;
    cuetracks = malloc(sizeof(mp3cue_track_t) * MP3CUE_DEFAULT_TRACK_NUMBER);
    if (cuetracks == NULL) {
        fprintf(stderr, "Could not allocate memory for tracks\n");
        retval = EXIT_FAILURE;
        goto exit;
    }
    cuefile.tracks = cuetracks;
    cuefile.track_number = 0;
    cuefile.max_track_number = MP3CUE_DEFAULT_TRACK_NUMBER;
    yymp3_cue_file = &cuefile;
    strncpy(cuefile.title, cuefilename, MP3CUE_MAX_STRING_LENGTH);

    /*M
      Open the input file.
    **/
    cuein = fopen(cuefilename, "r");
    if (cuein == NULL) {
        fprintf(stderr, "Could not open cuefile %s\n", cuefilename);
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Parse the input file.
    **/
    extern FILE *yyin;
    yyin = cuein;

    if (yyparse() != 0) {
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Open the MP3 file.
    **/
    file_t mp3file;
    if (!file_open_read(&mp3file, mp3filename)) {
        fprintf(stderr, "Could not open mp3 file: %s\n", mp3filename);
        retval = EXIT_FAILURE;
        return 0;
    }

    aq_t qin;
    aq_init(&qin);

    unsigned long current = 0;

    /*M
      For each track, cut out the relevant part and save it.
    **/
    unsigned int i;
    for (i = 0; i < cuefile.track_number; i++) {
        char outfilename[MP3CUE_MAX_STRING_LENGTH * 3 + 1];
        if (strlen(cuefile.tracks[i].performer) > 0 &&
            strlen(cuefile.tracks[i].title) > 0) {
            snprintf(outfilename, MP3CUE_MAX_STRING_LENGTH * 3,
                     "%02d. %s - %s.mp3", cuefile.tracks[i].number,
                     cuefile.tracks[i].performer, cuefile.tracks[i].title);
        } else {
            snprintf(outfilename, MP3CUE_MAX_STRING_LENGTH * 3,
                     "%02d. %s.mp3", cuefile.tracks[i].number,
                     cuefile.title);
        }

        aq_t qout;
        aq_init(&qout);

        /*M
          Open the output MP3 file.
        **/
        file_t outfile;
        if (!file_open_write(&outfile, outfilename)) {
            fprintf(stderr, "Could not open mp3 file: %s\n", outfilename);
            file_close(&mp3file);
            retval = EXIT_FAILURE;
            goto exit;
        }

        /* end time in msecs */
        unsigned long end = (((cuefile.tracks[i].index.minutes * 60) +
                              cuefile.tracks[i].index.seconds) * 100 +
                             cuefile.tracks[i].index.centiseconds) * 10;
        char from_buf[256], to_buf[256];
        format_time(current, from_buf, sizeof(from_buf));
        format_time(end, to_buf, sizeof(to_buf));
        printf("Extracting track %d (%s): %s - %s...\n", i, outfilename,
               from_buf, end ? to_buf : "end");

        /* write id3 tags */
        if (!mp3cue_write_id3(&outfile, &cuefile, &cuefile.tracks[i])) {
            fprintf(stderr, "Could not write id3 tags to file: %s\n", outfilename);
            file_close(&outfile);
            file_close(&mp3file);
            retval = EXIT_FAILURE;
            goto exit;
        }

        /*M
          Read in the input file

          Read while current < end or till the end of the file if it's the last track.
        **/
        while ((current < end) || (i == (cuefile.track_number - 1))) {
            mp3_frame_t frame;
            if (mp3_next_frame(&mp3file, &frame) > 0) {
                if (aq_add_frame(&qin, &frame)) {
                    adu_t *adu = aq_get_adu(&qin);
                    assert(adu != NULL);

                    if (aq_add_adu(&qout, adu)) {
                        mp3_frame_t *frame_out = aq_get_frame(&qout);
                        assert(frame_out != NULL);

                        memset(frame_out->raw, 0, 4 + frame_out->si_size);
                        if (!mp3_fill_hdr(frame_out) ||
                            !mp3_fill_si(frame_out) ||
                            (mp3_write_frame(&outfile, frame_out) <= 0)) {
                            fprintf(stderr, "Could not write frame\n");
                            file_close(&mp3file);
                            file_close(&outfile);
                            retval = 1;
                            goto exit;
                        }

                        free(frame_out);
                    }

                    free(adu);
                }

                current += frame.usec / 1000;
            } else {
                if (i != (cuefile.track_number - 1)) {
                    fprintf(stderr, "Could not read the next frame from the mp3 file...\n");
                }
                break;
            }
        }

        /*M
          Close the output file.
        **/
        file_close(&outfile);
        aq_destroy(&qout);

        fprintf(stderr, "%s written\n", outfilename);
    }

    /*M
      Close the input file.
    **/
    file_close(&mp3file);
    aq_destroy(&qin);


    /*M
      Cleanup the data structures.
    **/
    exit:
    if (cuein != NULL) {
        fclose(cuein);
    }
    if (cuetracks != NULL) {
        free(cuetracks);
    }

    if (cuefilename != NULL) {
        free(cuefilename);
    }

    return retval;
}